

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase283::run(TestCase283 *this)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  bool bVar1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *params;
  void *__buf;
  int __flags;
  undefined8 in_stack_fffffffffffffd00;
  bool local_2d4;
  bool local_2d3;
  DebugExpression<bool> local_2d2;
  bool local_2d1;
  bool _kj_shouldLog_3;
  DebugExpression<bool> _kjCondition_3;
  DebugExpression<bool_&> DStack_2d0;
  bool _kj_shouldLog_2;
  DebugExpression<bool_&> _kjCondition_2;
  SourceLocation local_2c0;
  Promise<void> local_2a8;
  bool local_29f;
  bool local_29e;
  DebugExpression<bool> local_29d;
  bool local_29c;
  bool local_29b;
  DebugExpression<bool> local_29a [2];
  undefined1 uStack_298;
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  Promise<void> local_280 [2];
  SourceLocation local_270;
  Promise<void> local_258 [2];
  SourceLocation local_248;
  undefined1 *local_230;
  undefined1 local_228 [48];
  Promise<void> local_1f8;
  Promise<void> local_1f0;
  undefined1 local_1e8 [48];
  Maybe<capnp::MessageSize> local_1b8;
  undefined1 local_1a0 [8];
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  request;
  bool returned;
  Promise<void> promise;
  undefined1 local_148 [8];
  Client client;
  int local_128;
  int handleCount;
  int callCount;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  Promise<void> local_100;
  Promise<void> local_f8;
  Promise<void> destructionPromise;
  undefined1 auStack_e8 [6];
  bool destroyed;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  PromiseFulfillerPair<void> paf;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase283 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  kj::WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)auStack_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x121,0xe);
  location_01.function = (char *)local_d8;
  location_01.fileName = (char *)uStack_e0;
  location_01.lineNumber = (int)in_stack_fffffffffffffd00;
  location_01.columnNumber = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  kj::newPromiseAndFulfiller<void>(location_01);
  destructionPromise.super_PromiseBase.node.ptr._6_1_ = 0;
  local_108 = (long)&destructionPromise.super_PromiseBase.node.ptr + 6;
  kj::Promise<void>::then<capnp::_::(anonymous_namespace)::TestCase283::run()::__0>
            (&local_100,(Type *)local_d0);
  __flags = 0x1d;
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)&callCount,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x123);
  location.function = (char *)uStack_118;
  location.fileName = (char *)_callCount;
  location._16_8_ = local_110;
  kj::Promise<void>::eagerlyEvaluate(&local_f8,&local_100,location);
  kj::Promise<void>::~Promise(&local_100);
  local_128 = 0;
  client._20_4_ = 0;
  kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
            ((kj *)&promise,&local_128,(int *)&client.field_0x14);
  capnproto_test::capnp::test::TestMoreStuff::Client::Client<capnp::_::TestMoreStuffImpl,void>
            ((Client *)local_148,(Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)&promise);
  kj::Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)&promise);
  kj::Promise<void>::Promise((Promise<void> *)&stack0xfffffffffffffea0,(void *)0x0);
  request.hook.ptr._7_1_ = 0;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_1b8);
  capnproto_test::capnp::test::TestMoreStuff::Client::expectCancelRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
              *)local_1a0,(Client *)local_148,&local_1b8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_1b8);
  params = kj::mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                     ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
            ((kj *)local_1e8,params);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestCapDestructor,void>
            ((Client *)(local_1e8 + 0x10),
             (Own<capnp::_::TestCapDestructor,_std::nullptr_t> *)local_1e8);
  capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams::Builder::setCap
            ((Builder *)local_1a0,(Client *)(local_1e8 + 0x10));
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)(local_1e8 + 0x10));
  kj::Own<capnp::_::TestCapDestructor,_std::nullptr_t>::~Own
            ((Own<capnp::_::TestCapDestructor,_std::nullptr_t> *)local_1e8);
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
          *)local_228,(int)local_1a0,__buf,local_110,__flags);
  local_230 = (undefined1 *)((long)&request.hook.ptr + 7);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>>::
  then<capnp::_::(anonymous_namespace)::TestCase283::run()::__1>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>>
              *)&local_1f8,(Type *)local_228);
  kj::SourceLocation::SourceLocation
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x130,0xf);
  location_00.function = local_248.function;
  location_00.fileName = local_248.fileName;
  location_00.lineNumber = local_248.lineNumber;
  location_00.columnNumber = local_248.columnNumber;
  kj::Promise<void>::eagerlyEvaluate(&local_1f0,&local_1f8,location_00);
  kj::Promise<void>::operator=((Promise<void> *)&stack0xfffffffffffffea0,&local_1f0);
  kj::Promise<void>::~Promise(&local_1f0);
  kj::Promise<void>::~Promise(&local_1f8);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults> *)
             local_228);
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::~Request((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
              *)local_1a0);
  kj::yield();
  kj::SourceLocation::SourceLocation
            (&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x135,3);
  kj::Promise<void>::wait(local_258,local_a8);
  kj::Promise<void>::~Promise(local_258);
  kj::yield();
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)&uStack_298,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x136,3);
  kj::Promise<void>::wait(local_280,local_a8);
  kj::Promise<void>::~Promise(local_280);
  local_29b = (bool)(~destructionPromise.super_PromiseBase.node.ptr._6_1_ & 1);
  local_29a[0] = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_29b);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_29a);
  if (!bVar1) {
    local_29c = kj::_::Debug::shouldLog(ERROR);
    while (local_29c != false) {
      kj::_::Debug::log<char_const(&)[30],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x139,ERROR,"\"failed: expected \" \"!(destroyed)\", _kjCondition",
                 (char (*) [30])"failed: expected !(destroyed)",local_29a);
      local_29c = false;
    }
  }
  local_29e = (bool)(~request.hook.ptr._7_1_ & 1);
  local_29d = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_29e);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_29d);
  if (!bVar1) {
    local_29f = kj::_::Debug::shouldLog(ERROR);
    while (local_29f != false) {
      kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x13a,ERROR,"\"failed: expected \" \"!(returned)\", _kjCondition",
                 (char (*) [29])"failed: expected !(returned)",&local_29d);
      local_29f = false;
    }
  }
  kj::Promise<void>::Promise(&local_2a8,(void *)0x0);
  kj::Promise<void>::operator=((Promise<void> *)&stack0xfffffffffffffea0,&local_2a8);
  kj::Promise<void>::~Promise(&local_2a8);
  kj::SourceLocation::SourceLocation
            (&local_2c0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x13d,3);
  kj::Promise<void>::wait(&local_f8,local_a8);
  DStack_2d0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&destructionPromise.super_PromiseBase.node.ptr + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xfffffffffffffd30)
  ;
  if (!bVar1) {
    local_2d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d1 != false) {
      kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x13f,ERROR,"\"failed: expected \" \"destroyed\", _kjCondition",
                 (char (*) [27])"failed: expected destroyed",&stack0xfffffffffffffd30);
      local_2d1 = false;
    }
  }
  local_2d3 = (bool)(~request.hook.ptr._7_1_ & 1);
  local_2d2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2d3);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_2d2);
  if (!bVar1) {
    local_2d4 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d4 != false) {
      kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x140,ERROR,"\"failed: expected \" \"!(returned)\", _kjCondition",
                 (char (*) [29])"failed: expected !(returned)",&local_2d2);
      local_2d4 = false;
    }
  }
  kj::Promise<void>::~Promise((Promise<void> *)&stack0xfffffffffffffea0);
  capnproto_test::capnp::test::TestMoreStuff::Client::~Client((Client *)local_148);
  kj::Promise<void>::~Promise(&local_f8);
  kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_d0);
  kj::WaitScope::~WaitScope((WaitScope *)local_a8);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Capability, AsyncCancelation) {
  // Tests cancellation.

  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  int callCount = 0;
  int handleCount = 0;

  test::TestMoreStuff::Client client(kj::heap<TestMoreStuffImpl>(callCount, handleCount));

  kj::Promise<void> promise = nullptr;

  bool returned = false;
  {
    auto request = client.expectCancelRequest();
    request.setCap(test::TestInterface::Client(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller))));
    promise = request.send().then(
        [&](Response<test::TestMoreStuff::ExpectCancelResults>&& response) {
      returned = true;
    }).eagerlyEvaluate(nullptr);
  }
  kj::yield().wait(waitScope);
  kj::yield().wait(waitScope);

  // We can detect that the method was canceled because it will drop the cap.
  EXPECT_FALSE(destroyed);
  EXPECT_FALSE(returned);

  promise = nullptr;  // request cancellation
  destructionPromise.wait(waitScope);

  EXPECT_TRUE(destroyed);
  EXPECT_FALSE(returned);
}